

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_12a34eb::MemPoolAccept::Workspace::~Workspace(Workspace *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  pointer pcVar3;
  CTxMemPoolEntry *__ptr;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
            (&(this->m_precomputed_txdata).m_spent_outputs);
  pcVar3 = (this->m_state).super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus.
           _M_p;
  paVar1 = &(this->m_state).super_ValidationState<TxValidationResult>.m_debug_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  pcVar3 = (this->m_state).super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus.
           _M_p;
  paVar1 = &(this->m_state).super_ValidationState<TxValidationResult>.m_reject_reason.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  __ptr = (this->m_entry)._M_t.
          super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>._M_t.
          super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>.
          super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl;
  if (__ptr != (CTxMemPoolEntry *)0x0) {
    std::default_delete<CTxMemPoolEntry>::operator()
              ((default_delete<CTxMemPoolEntry> *)&this->m_entry,__ptr);
  }
  (this->m_entry)._M_t.super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>
  ._M_t.super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>.
  super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl = (CTxMemPoolEntry *)0x0;
  std::_Rb_tree<$270907ca$>::~_Rb_tree(&(this->m_ancestors)._M_t);
  std::_Rb_tree<$270907ca$>::~_Rb_tree(&(this->m_iters_conflicting)._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    std::
    _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
    ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                 *)this);
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit Workspace(const CTransactionRef& ptx) : m_ptx(ptx), m_hash(ptx->GetHash()) {}